

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

int testing::internal::SumOverTestSuiteList
              (vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *case_list,
              offset_in_TestSuite_to_subr method)

{
  int iVar1;
  size_type_conflict sVar2;
  const_reference ppTVar3;
  long *plVar4;
  long in_RDX;
  code *in_RSI;
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *in_RDI;
  size_t i;
  int sum;
  code *local_58;
  ulong local_38;
  int local_2c;
  
  local_2c = 0;
  for (local_38 = 0;
      sVar2 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::size(in_RDI)
      , local_38 < sVar2; local_38 = local_38 + 1) {
    ppTVar3 = std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::operator[]
                        (in_RDI,local_38);
    plVar4 = (long *)((long)&(*ppTVar3)->_vptr_TestSuite + in_RDX);
    local_58 = in_RSI;
    if (((ulong)in_RSI & 1) != 0) {
      local_58 = *(code **)(in_RSI + *plVar4 + -1);
    }
    iVar1 = (*local_58)(plVar4);
    local_2c = iVar1 + local_2c;
  }
  return local_2c;
}

Assistant:

static int SumOverTestSuiteList(const std::vector<TestSuite*>& case_list,
                                int (TestSuite::*method)() const) {
  int sum = 0;
  for (size_t i = 0; i < case_list.size(); i++) {
    sum += (case_list[i]->*method)();
  }
  return sum;
}